

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O0

void negotiate(connectdata *conn)

{
  void *pvVar1;
  TELNET *tn;
  int i;
  connectdata *conn_local;
  
  pvVar1 = (conn->data->req).protop;
  for (tn._4_4_ = 0; tn._4_4_ < 0x28; tn._4_4_ = tn._4_4_ + 1) {
    if (tn._4_4_ != 1) {
      if (*(int *)((long)pvVar1 + (long)tn._4_4_ * 4 + 0x808) == 1) {
        set_local_option(conn,tn._4_4_,1);
      }
      if (*(int *)((long)pvVar1 + (long)tn._4_4_ * 4 + 0x1408) == 1) {
        set_remote_option(conn,tn._4_4_,1);
      }
    }
  }
  return;
}

Assistant:

static void negotiate(struct connectdata *conn)
{
  int i;
  struct TELNET *tn = (struct TELNET *) conn->data->req.protop;

  for(i = 0; i < CURL_NTELOPTS; i++) {
    if(i == CURL_TELOPT_ECHO)
      continue;

    if(tn->us_preferred[i] == CURL_YES)
      set_local_option(conn, i, CURL_YES);

    if(tn->him_preferred[i] == CURL_YES)
      set_remote_option(conn, i, CURL_YES);
  }
}